

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
* evaluation_speed_test_abi_cxx11_
            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *__return_storage_ptr__,ChebyshevExpansion *cee,vectype *xpts,long N)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  mapped_type *pmVar4;
  double *pdVar5;
  undefined8 *puVar6;
  long __tmp;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  double *__tmp_1;
  double *__ptr;
  long lVar11;
  double dVar12;
  double *local_78;
  undefined1 local_70 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *local_50;
  long local_48;
  double *local_40;
  long local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50 = __return_storage_ptr__;
  local_40 = (double *)std::chrono::_V2::system_clock::now();
  local_38 = N;
  if (N < 1) {
    uVar9 = 0;
    pdVar5 = (double *)0x0;
  }
  else {
    local_78 = (double *)0x0;
    uVar7 = 0;
    do {
      ChebTools::ChebyshevExpansion::y_recurrence_xscaled((ChebyshevExpansion *)local_70,&cee->m_c);
      uVar9 = local_70._8_8_;
      pdVar5 = (double *)local_70._0_8_;
      local_70._0_8_ = local_78;
      local_70._8_8_ = uVar7;
      free(local_78);
      N = N + -1;
      uVar7 = uVar9;
      local_78 = pdVar5;
    } while (N != 0);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"recurrence[vector]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_50,(key_type *)local_70);
  lVar11 = local_38;
  lVar3 = lVar3 - (long)local_40;
  local_40 = (double *)(double)local_38;
  *pmVar4 = (((double)lVar3 / 1000000000.0) / (double)local_40) * 1000000.0;
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_48 = std::chrono::_V2::system_clock::now();
  __ptr = pdVar5;
  local_78 = (double *)uVar9;
  if (0 < lVar11) {
    do {
      ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled((ChebyshevExpansion *)local_70,&cee->m_c);
      uVar9 = local_70._8_8_;
      pdVar5 = (double *)local_70._0_8_;
      local_70._8_8_ = local_78;
      local_70._0_8_ = __ptr;
      free(__ptr);
      local_78 = (double *)uVar9;
      lVar11 = lVar11 + -1;
      __ptr = pdVar5;
    } while (lVar11 != 0);
  }
  lVar11 = std::chrono::_V2::system_clock::now();
  local_70._0_8_ = local_70 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Clenshaw[vector]","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
           ::operator[](local_50,(key_type *)local_70);
  *pmVar4 = (((double)(lVar11 - local_48) / 1000000000.0) / (double)local_40) * 1000000.0;
  if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
    operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
  }
  local_48 = std::chrono::_V2::system_clock::now();
  uVar7 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (-1 < (long)uVar7) {
    if (uVar9 != uVar7) {
      free(pdVar5);
      if (uVar7 == 0) {
        pdVar5 = (double *)0x0;
      }
      else {
        if (uVar7 >> 0x3d != 0) {
LAB_00153e8e:
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = std::random_device::_M_fini;
          __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar5 = (double *)malloc(uVar7 * 8);
        if (uVar7 != 1 && ((ulong)pdVar5 & 0xf) != 0) goto LAB_001541c7;
        if (pdVar5 == (double *)0x0) goto LAB_00153e8e;
      }
    }
    if (0 < local_38) {
      lVar11 = 0;
      do {
        uVar8 = (uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows;
        if (0 < (int)uVar8) {
          uVar10 = (ulong)(uVar8 & 0x7fffffff);
          uVar9 = uVar10;
          do {
            if ((xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows < (long)uVar9) goto LAB_0015416a;
            dVar12 = ChebTools::ChebyshevExpansion::y_recurrence
                               (cee,(xpts->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                                    m_storage.m_data[uVar9 - 1]);
            if ((long)uVar7 < (long)uVar10) goto LAB_00154189;
            pdVar5[uVar9 - 1] = dVar12;
            bVar2 = 1 < (long)uVar9;
            uVar9 = uVar9 - 1;
          } while (bVar2);
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != local_38);
    }
    lVar11 = local_38;
    lVar3 = std::chrono::_V2::system_clock::now();
    local_70._0_8_ = local_70 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"recurrence[1x1]","");
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](local_50,(key_type *)local_70);
    *pmVar4 = (((double)(lVar3 - local_48) / 1000000000.0) / (double)local_40) * 1000000.0;
    if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    local_48 = std::chrono::_V2::system_clock::now();
    uVar9 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (-1 < (long)uVar9) {
      if (uVar7 != uVar9) {
        free(pdVar5);
        if (uVar9 != 0) {
          if (uVar9 >> 0x3d == 0) {
            pdVar5 = (double *)malloc(uVar9 * 8);
            if (uVar9 != 1 && ((ulong)pdVar5 & 0xf) != 0) {
LAB_001541c7:
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                            ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pdVar5 != (double *)0x0) goto LAB_0015403e;
          }
          puVar6 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar6 = std::random_device::_M_fini;
          __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar5 = (double *)0x0;
      }
LAB_0015403e:
      if (0 < lVar11) {
        lVar11 = 0;
        do {
          uVar8 = (uint)(xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_rows;
          if (0 < (int)uVar8) {
            uVar10 = (ulong)(uVar8 & 0x7fffffff);
            uVar7 = uVar10;
            do {
              if ((xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows < (long)uVar7) {
LAB_0015416a:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0xb5,
                              "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                             );
              }
              dVar12 = (xpts->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data[uVar7 - 1];
              dVar12 = ChebTools::ChebyshevExpansion::y_Clenshaw_xscaled
                                 (cee,((dVar12 + dVar12) - (cee->m_xmax + cee->m_xmin)) /
                                      (cee->m_xmax - cee->m_xmin));
              if ((long)uVar9 < (long)uVar10) {
LAB_00154189:
                __assert_fail("index >= 0 && index < size()",
                              "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                              ,0x1ab,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              pdVar5[uVar7 - 1] = dVar12;
              bVar2 = 1 < (long)uVar7;
              uVar7 = uVar7 - 1;
            } while (bVar2);
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != local_38);
      }
      lVar11 = std::chrono::_V2::system_clock::now();
      local_70._0_8_ = local_70 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"Clenshaw[1x1]","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](local_50,(key_type *)local_70);
      *pmVar4 = (((double)(lVar11 - local_48) / 1000000000.0) / (double)local_40) * 1000000.0;
      if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
        operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
      }
      free(pdVar5);
      return local_50;
    }
  }
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                ,0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

std::map<std::string, double> evaluation_speed_test(ChebyshevExpansion &cee, const vectype &xpts, long N) {
    std::map<std::string, double> output;
    vectype ypts;

    auto startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_recurrence_xscaled(xpts);
    }
    auto endTime = std::chrono::system_clock::now();
    auto elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    for (int i = 0; i < N; ++i) {
        ypts = cee.y_Clenshaw_xscaled(xpts);
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[vector]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_recurrence(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["recurrence[1x1]"] = elap_us;

    startTime = std::chrono::system_clock::now();
    ypts.resize(xpts.size());
    for (int i = 0; i < N; ++i) {
        for (int n = static_cast<int>(xpts.size()) - 1; n >= 0; --n) {
            ypts(n) = cee.y_Clenshaw(xpts(n));
        }
    }
    endTime = std::chrono::system_clock::now();
    elap_us = std::chrono::duration<double>(endTime - startTime).count() / N*1e6;
    output["Clenshaw[1x1]"] = elap_us;
    return output;
}